

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_bool(mg_session *session,int *value)

{
  undefined4 *in_RSI;
  mg_session *in_RDI;
  int status;
  uint8_t marker;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char local_19;
  int local_4;
  
  local_4 = mg_session_read_uint8
                      ((mg_session *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (uint8_t *)0x1081bd);
  if (local_4 == 0) {
    if (local_19 == -0x3e) {
      *in_RSI = 0;
      local_4 = 0;
    }
    else if (local_19 == -0x3d) {
      *in_RSI = 1;
      local_4 = 0;
    }
    else {
      mg_session_set_error(in_RDI,"wrong value marker");
      local_4 = -6;
    }
  }
  return local_4;
}

Assistant:

int mg_session_read_bool(mg_session *session, int *value) {
  uint8_t marker;
  MG_RETURN_IF_FAILED(mg_session_read_uint8(session, &marker));

  switch (marker) {
    case MG_MARKER_BOOL_FALSE:
      *value = 0;
      return 0;
    case MG_MARKER_BOOL_TRUE:
      *value = 1;
      return 0;
  }

  mg_session_set_error(session, "wrong value marker");
  return MG_ERROR_DECODING_FAILED;
}